

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboTestUtil::Texture3DShader::Texture3DShader
          (Texture3DShader *this,DataType samplerType,DataType outputType)

{
  GenericVecType type_;
  ShaderProgramDeclaration *pSVar1;
  char *pcVar2;
  allocator<char> local_489;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  FragmentSource local_388;
  allocator<char> local_361;
  string local_360;
  VertexSource local_340;
  allocator<char> local_319;
  string local_318;
  Uniform local_2f8;
  allocator<char> local_2c9;
  string local_2c8;
  Uniform local_2a8;
  allocator<char> local_279;
  string local_278;
  Uniform local_258;
  allocator<char> local_229;
  string local_228;
  Uniform local_208;
  FragmentOutput local_1e0;
  VertexToFragmentVarying local_1dc;
  allocator<char> local_1d1;
  string local_1d0;
  VertexAttribute local_1b0;
  allocator<char> local_171;
  string local_170;
  VertexAttribute local_150;
  ShaderProgramDeclaration local_128;
  DataType local_18;
  DataType local_14;
  DataType outputType_local;
  DataType samplerType_local;
  Texture3DShader *this_local;
  
  local_18 = outputType;
  local_14 = samplerType;
  _outputType_local = this;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"a_position",&local_171);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_150,&local_170,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_128,&local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"a_coord",&local_1d1);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_1b0,&local_1d0,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1b0);
  sglr::pdec::VertexToFragmentVarying::VertexToFragmentVarying(&local_1dc,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1dc);
  type_ = mapDataTypeToGenericVecType(local_18);
  sglr::pdec::FragmentOutput::FragmentOutput(&local_1e0,type_);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"u_sampler0",&local_229);
  sglr::pdec::Uniform::Uniform(&local_208,&local_228,local_14);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"u_scale",&local_279);
  sglr::pdec::Uniform::Uniform(&local_258,&local_278,TYPE_FLOAT_VEC4);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"u_bias",&local_2c9);
  sglr::pdec::Uniform::Uniform(&local_2a8,&local_2c8,TYPE_FLOAT_VEC4);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"u_depth",&local_319);
  sglr::pdec::Uniform::Uniform(&local_2f8,&local_318,TYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,&local_361);
  sglr::pdec::VertexSource::VertexSource(&local_340,&local_360);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_340);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"",&local_489);
  std::operator+(&local_468,&local_488,"#version 300 es\nuniform highp ");
  pcVar2 = glu::getDataTypeName(local_14);
  std::operator+(&local_448,&local_468,pcVar2);
  std::operator+(&local_428,&local_448,
                 " u_sampler0;\nuniform highp vec4 u_scale;\nuniform highp vec4 u_bias;\nuniform highp float u_depth;\nin highp vec2 v_coord;\nlayout(location = 0) out highp "
                );
  pcVar2 = glu::getDataTypeName(local_18);
  std::operator+(&local_408,&local_428,pcVar2);
  std::operator+(&local_3e8,&local_408," o_color;\nvoid main (void)\n{\n\to_color = ");
  pcVar2 = glu::getDataTypeName(local_18);
  std::operator+(&local_3c8,&local_3e8,pcVar2);
  std::operator+(&local_3a8,&local_3c8,
                 "(vec4(texture(u_sampler0, vec3(v_coord, u_depth))) * u_scale + u_bias);\n}\n");
  sglr::pdec::FragmentSource::FragmentSource(&local_388,&local_3a8);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_388);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  sglr::pdec::FragmentSource::~FragmentSource(&local_388);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  sglr::pdec::VertexSource::~VertexSource(&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  sglr::pdec::Uniform::~Uniform(&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  sglr::pdec::Uniform::~Uniform(&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  sglr::pdec::Uniform::~Uniform(&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  sglr::pdec::Uniform::~Uniform(&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_128);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_015ada78;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_015adab0;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_015adac8;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&(this->super_ShaderProgram).field_0x154,1.0);
  tcu::Vector<float,_4>::Vector(&this->m_texBias,0.0);
  this->m_depth = 0.0;
  this->m_outputType = local_18;
  return;
}

Assistant:

Texture3DShader::Texture3DShader (glu::DataType samplerType, glu::DataType outputType)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(mapDataTypeToGenericVecType(outputType))
							<< sglr::pdec::Uniform("u_sampler0", samplerType)
							<< sglr::pdec::Uniform("u_scale", glu::TYPE_FLOAT_VEC4)
							<< sglr::pdec::Uniform("u_bias", glu::TYPE_FLOAT_VEC4)
							<< sglr::pdec::Uniform("u_depth", glu::TYPE_FLOAT)
							<< sglr::pdec::VertexSource(
									"#version 300 es\n"
									"in highp vec4 a_position;\n"
									"in highp vec2 a_coord;\n"
									"out highp vec2 v_coord;\n"
									"void main (void)\n"
									"{\n"
									"	gl_Position = a_position;\n"
									"	v_coord = a_coord;\n"
									"}\n")
							<< sglr::pdec::FragmentSource(
									string("") +
									"#version 300 es\n"
									"uniform highp " + glu::getDataTypeName(samplerType) + " u_sampler0;\n"
									"uniform highp vec4 u_scale;\n"
									"uniform highp vec4 u_bias;\n"
									"uniform highp float u_depth;\n"
									"in highp vec2 v_coord;\n"
									"layout(location = 0) out highp " + glu::getDataTypeName(outputType) + " o_color;\n"
									"void main (void)\n"
									"{\n"
									"	o_color = " + glu::getDataTypeName(outputType) + "(vec4(texture(u_sampler0, vec3(v_coord, u_depth))) * u_scale + u_bias);\n"
									"}\n"))
	, m_texScale	(1.0f)
	, m_texBias		(0.0f)
	, m_depth		(0.0f)
	, m_outputType	(outputType)
{
}